

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynYield * ParseYield(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  SynBase *value_00;
  Lexeme *end;
  SynBase *value;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_yield);
  if (bVar1) {
    value_00 = ParseAssignment(ctx);
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_semicolon,"ERROR: yield statement must be followed by an expression or \';\'"
              );
    ctx_local = (ParseContext *)ParseContext::get<SynYield>(ctx);
    end = ParseContext::Previous(ctx);
    SynYield::SynYield((SynYield *)ctx_local,begin,end,value_00);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynYield *)ctx_local;
}

Assistant:

SynYield* ParseYield(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_yield))
	{
		// Optional
		SynBase *value = ParseAssignment(ctx);

		CheckConsume(ctx, lex_semicolon, "ERROR: yield statement must be followed by an expression or ';'");

		return new (ctx.get<SynYield>()) SynYield(start, ctx.Previous(), value);
	}

	return NULL;
}